

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void generateData(char *dataDir,char *bundleName)

{
  char cVar1;
  UBool UVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int iVar5;
  uint extraout_EAX;
  size_t sVar6;
  char *pcVar7;
  UHashElement *pUVar8;
  UNewDataMemory *pUVar9;
  int iVar10;
  uint uVar11;
  UNewDataMemory *unaff_RBP;
  UNewTrie *trie;
  char *comment;
  undefined8 *unaff_R12;
  UChar32 UVar12;
  UNewDataMemory *pUVar13;
  uint uVar14;
  UErrorCode errorCode;
  char cStack_91;
  char *pcStack_90;
  undefined8 *puStack_88;
  UNewDataMemory *pUStack_80;
  UNewDataMemory *pUStack_78;
  UNewDataMemory *pUStack_70;
  char local_59;
  UNewDataMemory local_58;
  int local_48;
  uint local_44;
  UNewDataMemory *local_40;
  char *local_38;
  UNewDataMemory *pErrorCode;
  
  local_58.file._0_4_ = 0;
  pUStack_70 = (UNewDataMemory *)0x10a44d;
  sVar6 = strlen(bundleName);
  pUStack_70 = (UNewDataMemory *)0x10a456;
  pcVar7 = (char *)uprv_malloc_63(sVar6 + 100);
  local_58.file._4_4_ = 0xffffffff;
  if (hashTable != (UHashtable *)0x0) {
    pUStack_70 = (UNewDataMemory *)0x10a47b;
    local_40 = (UNewDataMemory *)dataDir;
    iVar3 = uhash_count_63(hashTable);
    pUStack_70 = (UNewDataMemory *)0x10a48e;
    mappingData = (uint16_t *)uprv_calloc_63((long)mappingDataCapacity,2);
    local_58._12_4_ = iVar3;
    if (iVar3 < 1) {
      pUVar9 = (UNewDataMemory *)0x0;
      pUVar13 = (UNewDataMemory *)0x1;
    }
    else {
      pUVar9 = (UNewDataMemory *)0x0;
      pUVar13 = (UNewDataMemory *)0x1;
      uVar11 = 0;
      iVar5 = 0;
      local_38 = pcVar7;
      do {
        unaff_R12 = (undefined8 *)(ulong)uVar11;
        pUStack_70 = (UNewDataMemory *)0x10a4ca;
        pUVar8 = uhash_nextElement_63(hashTable,(int32_t *)((long)&local_58.file + 4));
        if (pUVar8 != (UHashElement *)0x0) {
          local_59 = pUVar13 == (UNewDataMemory *)0x4;
          local_44 = uVar11;
          do {
            UVar12 = (pUVar8->key).integer;
            unaff_R12 = (undefined8 *)(pUVar8->value).pointer;
            if (pUVar13 != (UNewDataMemory *)(ulong)local_44) {
              if ((int)local_44 < 4) {
                indexes[(long)((long)&pUVar13->file + 2)] = (int)currentIndex;
                cVar1 = local_59;
              }
              else {
                cVar1 = '\0';
              }
              if (cVar1 != '\0') {
                pUVar9 = (UNewDataMemory *)(ulong)(uint)(int)currentIndex;
              }
              local_44 = (uint)pUVar13;
            }
            if (pUVar13 == (UNewDataMemory *)(ulong)(uint)(int)*(short *)(unaff_R12 + 1)) {
              uVar14 = (uint)(ushort)currentIndex;
              pErrorCode = (UNewDataMemory *)(ulong)uVar14;
              uVar11 = uVar14 * 4 + 2;
              unaff_RBP = (UNewDataMemory *)(ulong)uVar11;
              local_48 = iVar5;
              pcVar7 = bundleName;
              dataDir = (char *)pUVar9;
              if ((ushort)uVar11 < 0xfff1) {
                pUStack_70 = (UNewDataMemory *)0x10a56b;
                local_58._8_4_ = UVar12;
                uVar4 = utrie_get32_63(sprepTrie,UVar12,(UBool *)0x0);
                if (uVar4 == 0) {
LAB_0010a585:
                  pUStack_70 = (UNewDataMemory *)0x10a598;
                  UVar2 = utrie_set32_63(sprepTrie,local_58._8_4_,(uint)unaff_RBP & 0xffff);
                  if (UVar2 != '\0') {
                    iVar5 = (int)currentIndex;
                    if (0x3fbe < *(short *)(unaff_R12 + 1) + iVar5) {
                      pUStack_70 = (UNewDataMemory *)0x10a847;
                      generateData_cold_2();
                      goto LAB_0010a847;
                    }
                    if ((UNewDataMemory *)0x3 < pUVar13) {
                      currentIndex = currentIndex + 1;
                      mappingData[iVar5] = (uint16_t)pUVar13;
                    }
                    pUStack_70 = (UNewDataMemory *)0x10a608;
                    u_memmove_63((UChar *)(mappingData + currentIndex),(UChar *)*unaff_R12,
                                 (int)*(short *)(unaff_R12 + 1));
                    currentIndex = currentIndex + *(short *)(unaff_R12 + 1);
                    pcVar7 = (char *)((long)&local_58.file + 4);
                    unaff_RBP = pUVar9;
                    dataDir = (char *)pUVar13;
                    pErrorCode = (UNewDataMemory *)bundleName;
                    if (currentIndex <= mappingDataCapacity) {
                      iVar5 = local_48 + 1;
                      goto LAB_0010a631;
                    }
                    goto LAB_0010a84c;
                  }
                  goto LAB_0010a851;
                }
                if (uVar4 == 0xfff2) {
                  unaff_RBP = (UNewDataMemory *)(ulong)(uVar14 << 2 | 3);
                  pErrorCode = unaff_RBP;
                  goto LAB_0010a585;
                }
              }
              else {
LAB_0010a847:
                pUStack_70 = (UNewDataMemory *)0x10a84c;
                generateData_cold_5();
LAB_0010a84c:
                pUStack_70 = (UNewDataMemory *)0x10a851;
                generateData_cold_1();
LAB_0010a851:
                pUStack_70 = (UNewDataMemory *)0x10a856;
                generateData_cold_3();
              }
              pUStack_70 = (UNewDataMemory *)0x10a85f;
              generateData_cold_4();
              goto LAB_0010a85f;
            }
LAB_0010a631:
            pUStack_70 = (UNewDataMemory *)0x10a640;
            pUVar8 = uhash_nextElement_63(hashTable,(int32_t *)((long)&local_58.file + 4));
            uVar11 = local_44;
          } while (pUVar8 != (UHashElement *)0x0);
        }
        pUVar13 = (UNewDataMemory *)((long)&pUVar13->file + 1);
        local_58.file._4_4_ = 0xffffffff;
        pcVar7 = local_38;
      } while (iVar5 < (int)local_58._12_4_);
    }
    unaff_RBP = pUVar9;
    dataDir = (char *)local_40;
    if ((uint)pUVar13 < 4) {
      indexes[((ulong)pUVar13 & 0xffffffff) + 2] = currentIndex + 1;
    }
    else {
      indexes[6] = (int32_t)pUVar9;
    }
  }
  pUStack_70 = (UNewDataMemory *)0x10a6ce;
  uVar11 = utrie_serialize_63(sprepTrie,generateData::sprepTrieBlock,100000,getFoldedValue,'\x01',
                              (UErrorCode *)&local_58);
  pErrorCode = (UNewDataMemory *)bundleName;
  if ((int)local_58.file < 1) {
    unaff_R12 = (undefined8 *)(ulong)uVar11;
    uVar14 = uVar11 + mappingDataCapacity * 2 + 0x40;
    unaff_RBP = (UNewDataMemory *)(ulong)uVar14;
    if (beVerbose != '\0') {
      pUStack_70 = (UNewDataMemory *)0x10a707;
      printf("size of sprep trie              %5u bytes\n",unaff_R12);
      pUStack_70 = (UNewDataMemory *)0x10a71b;
      printf("size of icudt63l_%s.spp contents: %ld bytes\n",bundleName,(long)(int)uVar14);
      pUStack_70 = (UNewDataMemory *)0x10a731;
      printf("size of mapping data array %5u bytes\n",(ulong)(uint)(mappingDataCapacity * 2));
      pUStack_70 = (UNewDataMemory *)0x10a746;
      printf("Number of code units in mappingData (currentIndex) are: %i \n",
             (ulong)(uint)(int)currentIndex);
      pUStack_70 = (UNewDataMemory *)0x10a75a;
      printf("Maximum length of the mapping string is : %i \n",(ulong)(uint)maxLength);
    }
    *pcVar7 = '\0';
    pUStack_70 = (UNewDataMemory *)0x10a768;
    strcat(pcVar7,bundleName);
    comment = (char *)0x0;
    if (haveCopyright != '\0') {
      comment = 
      " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
      ;
    }
    pErrorCode = &local_58;
    pUStack_70 = (UNewDataMemory *)0x10a7a1;
    pUVar9 = udata_create(dataDir,"spp",pcVar7,&dataInfo,comment,(UErrorCode *)pErrorCode);
    if (0 < (int)local_58.file) goto LAB_0010a869;
    indexes[1] = mappingDataCapacity * 2;
    pUStack_70 = (UNewDataMemory *)0x10a7d8;
    indexes[0] = uVar11;
    udata_writeBlock(pUVar9,indexes,0x40);
    pUStack_70 = (UNewDataMemory *)0x10a7ea;
    udata_writeBlock(pUVar9,generateData::sprepTrieBlock,uVar11);
    pUStack_70 = (UNewDataMemory *)0x10a7ff;
    udata_writeBlock(pUVar9,mappingData,indexes[1]);
    pErrorCode = &local_58;
    pUStack_70 = (UNewDataMemory *)0x10a80f;
    uVar11 = udata_finish(pUVar9,(UErrorCode *)pErrorCode);
    if ((int)local_58.file < 1) {
      if (uVar11 == uVar14) {
        if (hashTable != (UHashtable *)0x0) {
          pUStack_70 = (UNewDataMemory *)0x10a82b;
          uhash_close_63(hashTable);
        }
        pUStack_70 = (UNewDataMemory *)0x10a833;
        uprv_free_63(pcVar7);
        return;
      }
      goto LAB_0010a87d;
    }
  }
  else {
LAB_0010a85f:
    pUStack_70 = (UNewDataMemory *)0x10a869;
    generateData_cold_9();
LAB_0010a869:
    pUVar9 = (UNewDataMemory *)dataDir;
    pUStack_70 = (UNewDataMemory *)0x10a873;
    generateData_cold_8();
  }
  pUStack_70 = (UNewDataMemory *)0x10a87d;
  generateData_cold_7();
  uVar11 = extraout_EAX;
LAB_0010a87d:
  trie = (UNewTrie *)(ulong)uVar11;
  UVar12 = (UChar32)unaff_RBP;
  pUStack_70 = (UNewDataMemory *)getFoldedValue;
  generateData_cold_6();
  iVar5 = UVar12 + 0x400;
  pcStack_90 = pcVar7;
  puStack_88 = unaff_R12;
  pUStack_80 = pUVar9;
  pUStack_78 = pErrorCode;
  pUStack_70 = unaff_RBP;
  while( true ) {
    uVar4 = utrie_get32_63(trie,UVar12,&cStack_91);
    iVar10 = 0x20;
    if ((cStack_91 == '\0') && (iVar10 = 1, uVar4 != 0)) break;
    UVar12 = UVar12 + iVar10;
    if (iVar5 <= UVar12) {
      return;
    }
  }
  return;
}

Assistant:

extern void
generateData(const char *dataDir, const char* bundleName) {
    static uint8_t sprepTrieBlock[100000];

    UNewDataMemory *pData;
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t size, dataLength;
    char* fileName = (char*) uprv_malloc(uprv_strlen(bundleName) +100);

#if UCONFIG_NO_IDNA

    size=0;

#else

    int32_t sprepTrieSize;

    /* sort and add mapping data */
    storeMappingData();
    
    sprepTrieSize=utrie_serialize(sprepTrie, sprepTrieBlock, sizeof(sprepTrieBlock), getFoldedValue, TRUE, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "error: utrie_serialize(sprep trie) failed, %s\n", u_errorName(errorCode));
        exit(errorCode);
    }
    
    size = sprepTrieSize + mappingDataCapacity*U_SIZEOF_UCHAR + sizeof(indexes);
    if(beVerbose) {
        printf("size of sprep trie              %5u bytes\n", (int)sprepTrieSize);
        printf("size of " U_ICUDATA_NAME "_%s." DATA_TYPE " contents: %ld bytes\n", bundleName,(long)size);
        printf("size of mapping data array %5u bytes\n",(int)mappingDataCapacity * U_SIZEOF_UCHAR);
        printf("Number of code units in mappingData (currentIndex) are: %i \n", currentIndex);
        printf("Maximum length of the mapping string is : %i \n", (int)maxLength);
    }

#endif

    fileName[0]=0;
    uprv_strcat(fileName,bundleName);
    /* write the data */
    pData=udata_create(dataDir, DATA_TYPE, fileName, &dataInfo,
                       haveCopyright ? U_COPYRIGHT_STRING : NULL, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "gensprep: unable to create the output file, error %d\n", errorCode);
        exit(errorCode);
    }

#if !UCONFIG_NO_IDNA

    indexes[_SPREP_INDEX_TRIE_SIZE]=sprepTrieSize;
    indexes[_SPREP_INDEX_MAPPING_DATA_SIZE]=mappingDataCapacity*U_SIZEOF_UCHAR;
    
    udata_writeBlock(pData, indexes, sizeof(indexes));
    udata_writeBlock(pData, sprepTrieBlock, sprepTrieSize);
    udata_writeBlock(pData, mappingData, indexes[_SPREP_INDEX_MAPPING_DATA_SIZE]);
    

#endif

    /* finish up */
    dataLength=udata_finish(pData, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "gensprep: error %d writing the output file\n", errorCode);
        exit(errorCode);
    }

    if(dataLength!=size) {
        fprintf(stderr, "gensprep error: data length %ld != calculated size %ld\n",
            (long)dataLength, (long)size);
        exit(U_INTERNAL_PROGRAM_ERROR);
    }

#if !UCONFIG_NO_IDNA
    /* done with writing the data .. close the hashtable */
    if (hashTable != NULL) {
        uhash_close(hashTable);
    }
#endif

    uprv_free(fileName);
}